

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O2

void Sdm_ManFree(Sdm_Man_t *p)

{
  Hsh_IntMan_t *__ptr;
  
  Vec_WrdFree(p->vPerm6);
  Vec_IntFree(p->vMap2Perm);
  Vec_IntFree(p->vConfgRes);
  Vec_IntFree(p->pHash->vData);
  __ptr = p->pHash;
  Vec_IntFree(__ptr->vTable);
  Vec_WrdFree(__ptr->vObjs);
  free(__ptr);
  free(p);
  return;
}

Assistant:

void Sdm_ManFree( Sdm_Man_t * p )
{
    Vec_WrdFree( p->vPerm6 );
    Vec_IntFree( p->vMap2Perm );
    Vec_IntFree( p->vConfgRes );
    Vec_IntFree( p->pHash->vData );
    Hsh_IntManStop( p->pHash );
    ABC_FREE( p );
}